

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * google::protobuf::internal::FixedParser<unsigned_int>
                 (void *object,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  uint size;
  char *pcVar2;
  pair<const_char_*,_int> pVar3;
  
  bVar1 = *ptr;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback(ptr,(uint)bVar1);
    size = pVar3.second;
    pcVar2 = pVar3.first;
  }
  else {
    pcVar2 = ptr + 1;
  }
  if (pcVar2 != (char *)0x0) {
    pcVar2 = EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                       (&ctx->super_EpsCopyInputStream,pcVar2,size,
                        (RepeatedField<unsigned_int> *)object);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char* FixedParser(void* object, const char* ptr, ParseContext* ctx) {
  int size = ReadSize(&ptr);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ctx->ReadPackedFixed(ptr, size,
                              static_cast<RepeatedField<T>*>(object));
}